

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64emithelper.cpp
# Opt level: O3

int __thiscall asmjit::v1_14::a64::PrologEpilogInfo::init(PrologEpilogInfo *this,EVP_PKEY_CTX *ctx)

{
  EVP_PKEY_CTX EVar1;
  int iVar2;
  Iterator __begin3;
  long lVar3;
  uint32_t uVar4;
  GroupData *pGVar5;
  int iVar6;
  ulong uVar7;
  uint32_t uVar8;
  uint uVar9;
  
  lVar3 = 0;
  uVar4 = 0;
  do {
    pGVar5 = (this->groups)._data + lVar3;
    EVar1 = ctx[lVar3 + 0x50];
    uVar9 = *(uint *)(ctx + lVar3 * 4 + 0x40) & *(uint *)(ctx + lVar3 * 4 + 0x30);
    if ((lVar3 == 0) && (((byte)*ctx & 0x10) != 0)) {
      pGVar5->pairs[0].offset = (uint16_t)uVar4;
      pGVar5->pairs[0].ids[0] = '\x1d';
      pGVar5->pairs[0].ids[1] = '\x1e';
      uVar4 = uVar4 + (uint)(byte)EVar1 * 2;
      uVar9 = uVar9 & 0x9fffffff;
      uVar8 = 1;
    }
    else {
      uVar8 = 0;
    }
    if (uVar9 != 0) {
      uVar7 = 0;
      do {
        iVar2 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> iVar2 & 1) == 0; iVar2 = iVar2 + 1) {
          }
        }
        iVar6 = (int)uVar7;
        pGVar5->pairs[uVar8].ids[uVar7] = (uint8_t)iVar2;
        if (iVar6 == 1) {
          pGVar5->pairs[uVar8].offset = (uint16_t)uVar4;
          uVar4 = uVar4 + (uint)(byte)EVar1 + (uint)(byte)EVar1;
          uVar8 = uVar8 + 1;
        }
        uVar7 = (ulong)(iVar6 != 1);
        uVar9 = uVar9 - 1 & uVar9;
      } while (uVar9 != 0);
      if (iVar6 != 1) {
        pGVar5->pairs[uVar8].ids[1] = 0xff;
        pGVar5->pairs[uVar8].offset = (uint16_t)uVar4;
        uVar4 = uVar4 + (uint)(byte)EVar1 * 2;
        uVar8 = uVar8 + 1;
      }
    }
    pGVar5->pairCount = uVar8;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 2);
  this->sizeTotal = uVar4;
  return 0;
}

Assistant:

Error init(const FuncFrame& frame) noexcept {
    uint32_t offset = 0;

    for (RegGroup group : Support::EnumValues<RegGroup, RegGroup::kGp, RegGroup::kVec>{}) {
      GroupData& data = groups[group];

      uint32_t n = 0;
      uint32_t pairCount = 0;
      RegPair* pairs = data.pairs;

      uint32_t slotSize = frame.saveRestoreRegSize(group);
      uint32_t savedRegs = frame.savedRegs(group);

      if (group == RegGroup::kGp && frame.hasPreservedFP()) {
        // Must be at the beginning of the push/pop sequence.
        ASMJIT_ASSERT(pairCount == 0);

        pairs[0].offset = uint16_t(offset);
        pairs[0].ids[0] = Gp::kIdFp;
        pairs[0].ids[1] = Gp::kIdLr;
        offset += slotSize * 2;
        pairCount++;

        savedRegs &= ~Support::bitMask(Gp::kIdFp, Gp::kIdLr);
      }

      Support::BitWordIterator<uint32_t> it(savedRegs);
      while (it.hasNext()) {
        pairs[pairCount].ids[n] = uint8_t(it.next());

        if (++n == 2) {
          pairs[pairCount].offset = uint16_t(offset);
          offset += slotSize * 2;

          n = 0;
          pairCount++;
        }
      }

      if (n == 1) {
        pairs[pairCount].ids[1] = uint8_t(BaseReg::kIdBad);
        pairs[pairCount].offset = uint16_t(offset);
        offset += slotSize * 2;
        pairCount++;
      }

      data.pairCount = pairCount;
    }

    sizeTotal = offset;
    return kErrorOk;
  }